

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O0

void __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::grow_capacity
          (heterogeneous_queue<libtorrent::alert> *this,int size)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int *piVar7;
  pointer pcVar8;
  int len;
  header_t *src_hdr;
  char *end;
  char *dst;
  char *src;
  free_deleter local_29;
  unique_ptr<char,_libtorrent::aux::free_deleter> local_28;
  unique_ptr<char,_libtorrent::aux::free_deleter> new_storage;
  int local_14;
  int amount_to_grow;
  int size_local;
  heterogeneous_queue<libtorrent::alert> *this_local;
  
  new_storage._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
  super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.super__Head_base<0UL,_char_*,_false>
  ._M_head_impl._4_4_ = (this->m_capacity * 3) / 2;
  new_storage._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
  super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.super__Head_base<0UL,_char_*,_false>
  ._M_head_impl._0_4_ = 0x80;
  local_14 = size;
  _amount_to_grow = this;
  piVar7 = ::std::max<int>((int *)((long)&new_storage._M_t.
                                          super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>
                                          .super__Head_base<0UL,_char_*,_false>._M_head_impl + 4),
                           (int *)&new_storage);
  piVar7 = ::std::max<int>(&local_14,piVar7);
  iVar4 = *piVar7;
  pcVar8 = (pointer)malloc((long)(this->m_capacity + iVar4));
  ::std::unique_ptr<char,libtorrent::aux::free_deleter>::
  unique_ptr<libtorrent::aux::free_deleter,void>
            ((unique_ptr<char,libtorrent::aux::free_deleter> *)&local_28,pcVar8,&local_29);
  bVar6 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (!bVar6) {
    libtorrent::aux::throw_ex<std::bad_alloc>();
  }
  dst = ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  end = ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&local_28);
  pcVar8 = ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  iVar5 = this->m_size;
  for (; dst < pcVar8 + iVar5; dst = dst + (ulong)bVar1 + 0x10 + (int)(uint)uVar3) {
    *(undefined8 *)end = *(undefined8 *)dst;
    *(undefined8 *)(end + 8) = *(undefined8 *)(dst + 8);
    bVar1 = dst[2];
    bVar2 = dst[2];
    uVar3 = *(ushort *)dst;
    (**(code **)(dst + 8))(end + (ulong)bVar2 + 0x10,dst + (ulong)bVar1 + 0x10);
    end = end + (ulong)bVar2 + 0x10 + (int)(uint)uVar3;
  }
  ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::swap(&this->m_storage,&local_28);
  this->m_capacity = iVar4 + this->m_capacity;
  ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::~unique_ptr(&local_28);
  return;
}

Assistant:

void grow_capacity(int const size)
		{
			int const amount_to_grow = (std::max)(size
				, (std::max)(m_capacity * 3 / 2, 128));

			// we use malloc() to guarantee alignment
			std::unique_ptr<char, aux::free_deleter> new_storage(
				static_cast<char*>(std::malloc(std::size_t(m_capacity + amount_to_grow)))
				, aux::free_deleter());

			if (!new_storage)
				aux::throw_ex<std::bad_alloc>();

			char* src = m_storage.get();
			char* dst = new_storage.get();
			char const* const end = m_storage.get() + m_size;
			while (src < end)
			{
				header_t* src_hdr = reinterpret_cast<header_t*>(src);
				new (dst) header_t(*src_hdr);
				src += sizeof(header_t) + src_hdr->pad_bytes;
				dst += sizeof(header_t) + src_hdr->pad_bytes;
				int const len = src_hdr->len;
				TORRENT_ASSERT(src + len <= end);
				// this is no-throw
				src_hdr->move(dst, src);
				src_hdr->~header_t();
				src += len;
				dst += len;
			}

			m_storage.swap(new_storage);
			m_capacity += amount_to_grow;

#ifdef TORRENT_ADDRESS_SANITIZER
			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, m_storage.get()
				, m_storage.get() + m_size);
#endif
		}